

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall
ON_SubDVertex::Internal_SetInteriorCreaseVertexSharpnessForExperts
          (ON_SubDVertex *this,double interior_crease_vertex_sharpness,bool bSkipEdgeCountTest)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  float fVar4;
  
  fVar4 = 0.0;
  if ((((0.0 < interior_crease_vertex_sharpness) && (this->m_vertex_tag == Crease)) &&
      (0.0 <= interior_crease_vertex_sharpness)) && (interior_crease_vertex_sharpness <= 4.0)) {
    fVar4 = (float)interior_crease_vertex_sharpness;
    uVar1 = this->m_edge_count;
    uVar2 = this->m_face_count;
    if (uVar1 != uVar2 || uVar2 < 2) {
      bVar3 = uVar2 + 1 != (uint)uVar1;
      if ((uVar2 == 0 || bVar3) || ((this->super_ON_SubDComponentBase).m_level == '\0')) {
        if (!bSkipEdgeCountTest) {
          return;
        }
        if ((uVar2 == 0 || bVar3) && (uVar2 != 0 || uVar1 != 0)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                     ,0x1513,"","This probably should not be happening.");
          fVar4 = 0.0;
        }
      }
    }
  }
  this->m_interior_crease_vertex_sharpness = fVar4;
  return;
}

Assistant:

void ON_SubDVertex::Internal_SetInteriorCreaseVertexSharpnessForExperts(
  double interior_crease_vertex_sharpness,
  bool bSkipEdgeCountTest
) const
{
  // NOTE WELL:
  // This function is used to set m_crease_sector_vertex_sharpness when the vertex is part
  // of a complete SubD.
  if (ON_SubDVertexTag::Crease == m_vertex_tag
    && interior_crease_vertex_sharpness > 0.0
    && ON_SubDEdgeSharpness::IsValidValue(interior_crease_vertex_sharpness, false)
    )
  {
    // nonzero vertex sharpness on a crease vertex.
    // Because, even with the bSingleSectorSubset parameter, it's impossible to know the context 
    // when ON_SubDVertex.VertexSharpness() is called (complete SubD or singel sector subset)
    // we test for a change to the value before setting it so debugger breakpoints can
    // be set and triggered at useful times.
    const float f = (float)interior_crease_vertex_sharpness;
    if (m_edge_count == m_face_count && m_face_count >= 2)
    {
      // This is a 2 sector crease vertex and is exactly
      // the case where m_crease_sector_vertex_sharpness is useful.
      // If the sectors have different maximum edge end sharpnesses at this
      // vertex, then this value is critical. The sector with the smaller
      // maximum edge end sharpness must use this value when the
      // vertex subdivision point is calculated so the subdivision
      // and limit surface point are correct when calculated from
      // either sector.
      this->m_interior_crease_vertex_sharpness = f;
    }
    else
    {
      const bool bOneSector = m_edge_count == m_face_count + 1 && m_face_count >= 1;
      if (bOneSector && m_level > 0)
      {
        // The situation should be that the calling code knows for sure
        // this is a 1 sector crease vertex and that sector is a 
        // subset taken from a 2 sector crease vertex (in low level evaluation code)
        // and interior_crease_vertex_sharpness was calculated using both sectors
        // (or is a subdivision of a value calculated using both sectors).
        // One place this happens is in ON_SubDVertexQuadSector::Subdivide().
        // This is a good location for a breakpoint.
        this->m_interior_crease_vertex_sharpness = f;
      }
      else if (bSkipEdgeCountTest)
      {
        // When bSkipEdgeCountTest = true, the expert caller is stating
        // this is some type of special case when the vertex isn't completely
        // connected the the entire SubD. It is typically at some stage of subdivision
        // where either a the subdivided SubD is under construction or
        // during low level evaluation where a copy of 1 side of a 2 sector crease
        // is being created so limit surface information can be calculated.
        // 
        // Each case is separated out so it's possible to surgically debug with simple breakpoints.
        if (bOneSector)
        {
          // One sector of a level 0 vertex is being copied and the expert caller
          // set bSkipEdgeCountTest=true to inform us this is a special case.
          // One place this happens is in
          // ON_SubDVertexQuadSector::Initialize(ON_SubDVertexTag center_vertex_tag, double center_vertex_sharpness, ...).
          this->m_interior_crease_vertex_sharpness = f;
        }
        else if (0 == m_edge_count && 0 == m_face_count)
        {
          // A vertex is being copied, the edges and faces have not been attached yet,
          // and the expert caller set bSkipEdgeCountTest=true to inform us this is a
          // special case.
          // One place this happens is in
          // ON_SubD_FixedSizeHeap::AllocateVertex(ON_SubDVertex* vertex0,unsigned int edge_capacity)
          // where the subdivision vertex of vertex0 is being created and the edges and faces
          // have not been allocated (and hence not attached) yet.
          // Good place for a breakpoint.
          this->m_interior_crease_vertex_sharpness = f;
        }
        else
        {
          // If you end up here and it's a valid state, add a comment.
          // If it's confusing, please ask Dale Lear for some help.
          ON_ERROR("This probably should not be happening.");
          // Nothing is accomplished by setting this value and 
          // having it set can cause errors when sharpnesses are edited.      
          // Good place for a breakpoint.
          this->Internal_ClearInteriorCreaseVertexSharpnessForExperts();
        }
      }
    }
  }
  else
    this->Internal_ClearInteriorCreaseVertexSharpnessForExperts();
}